

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O0

cmn_t * cmn_init(int32 veclen)

{
  cmn_t *pcVar1;
  mfcc_t *pmVar2;
  cmn_t *cmn;
  int32 veclen_local;
  
  pcVar1 = (cmn_t *)__ckd_calloc__(1,0x20,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
                                   ,0x58);
  pcVar1->veclen = veclen;
  pmVar2 = (mfcc_t *)
           __ckd_calloc__((long)veclen,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
                          ,0x5a);
  pcVar1->cmn_mean = pmVar2;
  pmVar2 = (mfcc_t *)
           __ckd_calloc__((long)veclen,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
                          ,0x5b);
  pcVar1->cmn_var = pmVar2;
  pmVar2 = (mfcc_t *)
           __ckd_calloc__((long)veclen,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
                          ,0x5c);
  pcVar1->sum = pmVar2;
  pcVar1->nframe = 0;
  return pcVar1;
}

Assistant:

cmn_t *
cmn_init(int32 veclen)
{
    cmn_t *cmn;
    cmn = (cmn_t *) ckd_calloc(1, sizeof(cmn_t));
    cmn->veclen = veclen;
    cmn->cmn_mean = (mfcc_t *) ckd_calloc(veclen, sizeof(mfcc_t));
    cmn->cmn_var = (mfcc_t *) ckd_calloc(veclen, sizeof(mfcc_t));
    cmn->sum = (mfcc_t *) ckd_calloc(veclen, sizeof(mfcc_t));
    cmn->nframe = 0;

    return cmn;
}